

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void huelang::InitializeCore(Environment *env)

{
  unsigned_long uVar1;
  Definition *pDVar2;
  undefined8 *puVar3;
  Word WVar4;
  Word word;
  Word word_00;
  Word word_01;
  Word word_02;
  Word word_03;
  Word word_04;
  Word word_05;
  Word word_06;
  allocator<char> local_2d9;
  string local_2d8;
  unsigned_short local_2b8;
  Word useword;
  Definition *undefineddefinition;
  CompositeDefinition *undefinedworddefptr;
  string local_278;
  unsigned_short uStack_258;
  undefined6 uStack_256;
  Word undefinedword;
  Definition *preevaldefinition;
  string local_228;
  unsigned_short uStack_208;
  undefined6 uStack_206;
  Word preevalword;
  allocator<char> local_1d9;
  string local_1d8;
  unsigned_short uStack_1b8;
  undefined6 uStack_1b6;
  Word inactionword;
  allocator<char> local_189;
  string local_188;
  unsigned_short uStack_168;
  undefined6 uStack_166;
  Word compositeword;
  allocator<char> local_139;
  string local_138;
  unsigned_short uStack_118;
  undefined6 uStack_116;
  Word undefinedfinalword;
  allocator<char> local_e9;
  string local_e8;
  unsigned_short uStack_c8;
  undefined6 uStack_c6;
  Word wordcompword;
  allocator<char> local_99;
  string local_98;
  unsigned_short uStack_78;
  undefined6 uStack_76;
  Word intflagword;
  allocator<char> local_41;
  string local_40;
  unsigned_short uStack_20;
  undefined6 uStack_1e;
  Word primaryword;
  Environment *env_local;
  
  primaryword.minor = (unsigned_long)env;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"primary",&local_41);
  WVar4 = DefinitionTable::TokToWord(&env->definitionTable,&local_40);
  primaryword._0_8_ = WVar4.minor;
  uStack_20 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  intflagword.minor = CONCAT62(uStack_1e,uStack_20);
  WVar4._0_8_ = intflagword.minor & 0xffffffff;
  WVar4.minor = primaryword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,WVar4,__primary);
  uVar1 = primaryword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"__intstate",&local_99);
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_98);
  intflagword._0_8_ = WVar4.minor;
  uStack_78 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  wordcompword.minor = CONCAT62(uStack_76,uStack_78);
  word._0_8_ = wordcompword.minor & 0xffffffff;
  word.minor = intflagword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,word,__instate_flag);
  uVar1 = primaryword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"__wordcomprehension",&local_e9);
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_e8);
  wordcompword._0_8_ = WVar4.minor;
  uStack_c8 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  undefinedfinalword.minor = CONCAT62(uStack_c6,uStack_c8);
  word_00._0_8_ = undefinedfinalword.minor & 0xffffffff;
  word_00.minor = wordcompword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,word_00,__word_comprehension);
  uVar1 = primaryword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"__undefinedfinal",&local_139);
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_138);
  undefinedfinalword._0_8_ = WVar4.minor;
  uStack_118 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  compositeword.minor = CONCAT62(uStack_116,uStack_118);
  word_01._0_8_ = compositeword.minor & 0xffffffff;
  word_01.minor = undefinedfinalword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,word_01,__undefined_final);
  uVar1 = primaryword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"composite",&local_189);
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_188);
  compositeword._0_8_ = WVar4.minor;
  uStack_168 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  inactionword.minor = CONCAT62(uStack_166,uStack_168);
  word_02._0_8_ = inactionword.minor & 0xffffffff;
  word_02.minor = compositeword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,word_02,__composite);
  uVar1 = primaryword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"inaction",&local_1d9);
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_1d8);
  inactionword._0_8_ = WVar4.minor;
  uStack_1b8 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  preevalword.minor = CONCAT62(uStack_1b6,uStack_1b8);
  word_03._0_8_ = preevalword.minor & 0xffffffff;
  word_03.minor = inactionword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,word_03,__inaction);
  uVar1 = primaryword.minor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"preeval",(allocator<char> *)((long)&preevaldefinition + 7));
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_228);
  preevalword._0_8_ = WVar4.minor;
  uStack_208 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&preevaldefinition + 7));
  undefinedword.minor = CONCAT62(uStack_206,uStack_208);
  word_04._0_8_ = undefinedword.minor & 0xffffffff;
  word_04.minor = preevalword._0_8_;
  pDVar2 = DefinitionTable::operator[]((DefinitionTable *)primaryword.minor,word_04);
  uVar1 = primaryword.minor;
  *(ulong *)&pDVar2->type = CONCAT62(uStack_1b6,uStack_1b8);
  (pDVar2->type).minor = inactionword._0_8_;
  (pDVar2->value).pointer = (void *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"undefined",(allocator<char> *)((long)&undefinedworddefptr + 7));
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_278);
  undefinedword._0_8_ = WVar4.minor;
  uStack_258 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)((long)&undefinedworddefptr + 7));
  puVar3 = (undefined8 *)operator_new(0x20);
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  *puVar3 = CONCAT62(uStack_c6,uStack_c8);
  puVar3[1] = wordcompword._0_8_;
  puVar3[2] = CONCAT62(uStack_116,uStack_118);
  puVar3[3] = undefinedfinalword._0_8_;
  useword.minor = CONCAT62(uStack_256,uStack_258);
  word_05._0_8_ = useword.minor & 0xffffffff;
  word_05.minor = undefinedword._0_8_;
  pDVar2 = DefinitionTable::operator[]((DefinitionTable *)primaryword.minor,word_05);
  uVar1 = primaryword.minor;
  *(ulong *)&pDVar2->type = CONCAT62(uStack_166,uStack_168);
  (pDVar2->type).minor = compositeword._0_8_;
  (pDVar2->value).pointer = puVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"use",&local_2d9);
  WVar4 = DefinitionTable::TokToWord((DefinitionTable *)uVar1,&local_2d8);
  useword._0_8_ = WVar4.minor;
  local_2b8 = WVar4.major;
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  word_06._2_6_ = 0;
  word_06.major = local_2b8;
  word_06.minor = useword._0_8_;
  Environment::AddPrimaryDefinition((Environment *)primaryword.minor,word_06,__use);
  return;
}

Assistant:

void InitializeCore(Environment& env) {
        //Word wordword = env.definitionTable.TokToWord(WORDWORD);

        Word primaryword = env.definitionTable.TokToWord(PRIMARYDEFINITIONWORD);
        env.AddPrimaryDefinition(primaryword, &__primary);

        Word intflagword = env.definitionTable.TokToWord(INTSTATEFLAG);
        env.AddPrimaryDefinition(intflagword, &__instate_flag);

        Word wordcompword 
            = env.definitionTable.TokToWord(WORDCOMPREHENSIONWORD);
        env.AddPrimaryDefinition(wordcompword, &__word_comprehension);

        Word undefinedfinalword
            = env.definitionTable.TokToWord(UNDEFINEDFINALWORD);
        env.AddPrimaryDefinition(undefinedfinalword, &__undefined_final);

        Word compositeword = env.definitionTable.TokToWord(COMPOSITEWORD);
        env.AddPrimaryDefinition(compositeword, &__composite);

        Word inactionword = env.definitionTable.TokToWord(INACTIONWORD);
        env.AddPrimaryDefinition(inactionword, &__inaction);

        Word preevalword = env.definitionTable.TokToWord(PREEVALWORD);
        Definition& preevaldefinition = env.definitionTable[preevalword];
        preevaldefinition.type = inactionword;
        preevaldefinition.value.number = 0;

        Word undefinedword = env.definitionTable.TokToWord(UNDEFINEDWORD);
        CompositeDefinition *undefinedworddefptr = new CompositeDefinition();
        undefinedworddefptr->f = wordcompword;
        undefinedworddefptr->g = undefinedfinalword;
        Definition& undefineddefinition 
            = env.definitionTable[undefinedword];
        undefineddefinition.type = compositeword;
        undefineddefinition.value.pointer = undefinedworddefptr;

        Word useword = env.definitionTable.TokToWord(USEWORD);
        env.AddPrimaryDefinition(useword, __use);
    }